

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

ImFont * __thiscall ImFontAtlas::AddFont(ImFontAtlas *this,ImFontConfig *font_cfg)

{
  ImFont *pIVar1;
  ImFontConfig *pIVar2;
  ImFont **ppIVar3;
  void *__dest;
  ImFont *local_20;
  
  if (this->Locked == true) {
    __assert_fail("!Locked && \"Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui_draw.cpp"
                  ,0x66a,"ImFont *ImFontAtlas::AddFont(const ImFontConfig *)");
  }
  if ((font_cfg->FontData != (void *)0x0) && (0 < font_cfg->FontDataSize)) {
    if (font_cfg->SizePixels <= 0.0) {
      __assert_fail("font_cfg->SizePixels > 0.0f",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui_draw.cpp"
                    ,0x66c,"ImFont *ImFontAtlas::AddFont(const ImFontConfig *)");
    }
    if (font_cfg->MergeMode == false) {
      pIVar1 = (ImFont *)ImGui::MemAlloc(0x70);
      ImFont::ImFont(pIVar1);
      local_20 = pIVar1;
      ImVector<ImFont_*>::push_back(&this->Fonts,&local_20);
    }
    else if ((this->Fonts).Size == 0) {
      __assert_fail("!Fonts.empty() && \"Cannot use MergeMode for the first font\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui_draw.cpp"
                    ,0x672,"ImFont *ImFontAtlas::AddFont(const ImFontConfig *)");
    }
    ImVector<ImFontConfig>::push_back(&this->ConfigData,font_cfg);
    pIVar2 = ImVector<ImFontConfig>::back(&this->ConfigData);
    pIVar1 = pIVar2->DstFont;
    if (pIVar1 == (ImFont *)0x0) {
      ppIVar3 = ImVector<ImFont_*>::back(&this->Fonts);
      pIVar1 = *ppIVar3;
      pIVar2->DstFont = pIVar1;
    }
    if (pIVar2->FontDataOwnedByAtlas == false) {
      __dest = ImGui::MemAlloc((long)pIVar2->FontDataSize);
      pIVar2->FontData = __dest;
      pIVar2->FontDataOwnedByAtlas = true;
      memcpy(__dest,font_cfg->FontData,(long)pIVar2->FontDataSize);
      pIVar1 = pIVar2->DstFont;
    }
    if (pIVar1->EllipsisChar == 0xffff) {
      pIVar1->EllipsisChar = font_cfg->EllipsisChar;
    }
    ClearTexData(this);
    return pIVar2->DstFont;
  }
  __assert_fail("font_cfg->FontData != __null && font_cfg->FontDataSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui_draw.cpp"
                ,0x66b,"ImFont *ImFontAtlas::AddFont(const ImFontConfig *)");
}

Assistant:

ImFont* ImFontAtlas::AddFont(const ImFontConfig* font_cfg)
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    IM_ASSERT(font_cfg->FontData != NULL && font_cfg->FontDataSize > 0);
    IM_ASSERT(font_cfg->SizePixels > 0.0f);

    // Create new font
    if (!font_cfg->MergeMode)
        Fonts.push_back(IM_NEW(ImFont));
    else
        IM_ASSERT(!Fonts.empty() && "Cannot use MergeMode for the first font"); // When using MergeMode make sure that a font has already been added before. You can use ImGui::GetIO().Fonts->AddFontDefault() to add the default imgui font.

    ConfigData.push_back(*font_cfg);
    ImFontConfig& new_font_cfg = ConfigData.back();
    if (new_font_cfg.DstFont == NULL)
        new_font_cfg.DstFont = Fonts.back();
    if (!new_font_cfg.FontDataOwnedByAtlas)
    {
        new_font_cfg.FontData = IM_ALLOC(new_font_cfg.FontDataSize);
        new_font_cfg.FontDataOwnedByAtlas = true;
        memcpy(new_font_cfg.FontData, font_cfg->FontData, (size_t)new_font_cfg.FontDataSize);
    }

    if (new_font_cfg.DstFont->EllipsisChar == (ImWchar)-1)
        new_font_cfg.DstFont->EllipsisChar = font_cfg->EllipsisChar;

    // Invalidate texture
    ClearTexData();
    return new_font_cfg.DstFont;
}